

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImGui::RenderArrowPointingAt
               (ImDrawList *draw_list,ImVec2 pos,ImVec2 half_sz,ImGuiDir direction,ImU32 col)

{
  float fVar1;
  float fVar2;
  ImVec2 local_68;
  ImVec2 local_60;
  ImVec2 local_58;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  ImVec2 local_30;
  ImU32 local_28;
  ImGuiDir local_24;
  ImU32 col_local;
  ImGuiDir direction_local;
  ImDrawList *draw_list_local;
  ImVec2 half_sz_local;
  ImVec2 pos_local;
  
  half_sz_local.x = pos.x;
  half_sz_local.y = pos.y;
  draw_list_local._0_4_ = half_sz.x;
  draw_list_local._4_4_ = half_sz.y;
  local_28 = col;
  local_24 = direction;
  _col_local = draw_list;
  draw_list_local = (ImDrawList *)half_sz;
  half_sz_local = pos;
  switch(direction) {
  case 0:
    fVar1 = half_sz_local.x + draw_list_local._0_4_;
    fVar2 = half_sz_local.y - draw_list_local._4_4_;
    ImVec2::ImVec2(&local_30,fVar1,fVar2);
    ImVec2::ImVec2(&local_38,half_sz_local.x + draw_list_local._0_4_,
                   half_sz_local.y + draw_list_local._4_4_);
    ImDrawList::AddTriangleFilled(draw_list,&local_30,&local_38,&half_sz_local,local_28);
    break;
  case 1:
    fVar1 = half_sz_local.x - draw_list_local._0_4_;
    fVar2 = half_sz_local.y + draw_list_local._4_4_;
    ImVec2::ImVec2(&local_40,fVar1,fVar2);
    ImVec2::ImVec2(&local_48,half_sz_local.x - draw_list_local._0_4_,
                   half_sz_local.y - draw_list_local._4_4_);
    ImDrawList::AddTriangleFilled(draw_list,&local_40,&local_48,&half_sz_local,local_28);
    break;
  case 2:
    fVar1 = half_sz_local.x + draw_list_local._0_4_;
    fVar2 = half_sz_local.y + draw_list_local._4_4_;
    ImVec2::ImVec2(&local_50,fVar1,fVar2);
    ImVec2::ImVec2(&local_58,half_sz_local.x - draw_list_local._0_4_,
                   half_sz_local.y + draw_list_local._4_4_);
    ImDrawList::AddTriangleFilled(draw_list,&local_50,&local_58,&half_sz_local,local_28);
    break;
  case 3:
    fVar1 = half_sz_local.x - draw_list_local._0_4_;
    fVar2 = half_sz_local.y - draw_list_local._4_4_;
    ImVec2::ImVec2(&local_60,fVar1,fVar2);
    ImVec2::ImVec2(&local_68,half_sz_local.x + draw_list_local._0_4_,
                   half_sz_local.y - draw_list_local._4_4_);
    ImDrawList::AddTriangleFilled(draw_list,&local_60,&local_68,&half_sz_local,local_28);
    break;
  case -1:
  case 4:
  }
  return;
}

Assistant:

void ImGui::RenderArrowPointingAt(ImDrawList* draw_list, ImVec2 pos, ImVec2 half_sz, ImGuiDir direction, ImU32 col)
{
    switch (direction)
    {
    case ImGuiDir_Left:  draw_list->AddTriangleFilled(ImVec2(pos.x + half_sz.x, pos.y - half_sz.y), ImVec2(pos.x + half_sz.x, pos.y + half_sz.y), pos, col); return;
    case ImGuiDir_Right: draw_list->AddTriangleFilled(ImVec2(pos.x - half_sz.x, pos.y + half_sz.y), ImVec2(pos.x - half_sz.x, pos.y - half_sz.y), pos, col); return;
    case ImGuiDir_Up:    draw_list->AddTriangleFilled(ImVec2(pos.x + half_sz.x, pos.y + half_sz.y), ImVec2(pos.x - half_sz.x, pos.y + half_sz.y), pos, col); return;
    case ImGuiDir_Down:  draw_list->AddTriangleFilled(ImVec2(pos.x - half_sz.x, pos.y - half_sz.y), ImVec2(pos.x + half_sz.x, pos.y - half_sz.y), pos, col); return;
    case ImGuiDir_None: case ImGuiDir_COUNT: break; // Fix warnings
    }
}